

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_GL.cpp
# Opt level: O0

void __thiscall
Diligent::SerializedPipelineStateImpl::PatchShadersGL<Diligent::ComputePipelineStateCreateInfo>
          (SerializedPipelineStateImpl *this,ComputePipelineStateCreateInfo *CreateInfo)

{
  bool bVar1;
  reference pvVar2;
  Char *pCVar3;
  value_type *pvVar4;
  reference pvVar5;
  ShaderCreateInfo *__src;
  CompiledShaderGL *this_00;
  char (*pacVar6) [86];
  char (*Args_1) [86];
  char (*Args_1_00) [64];
  long lVar7;
  undefined8 *__dest;
  undefined8 *puVar8;
  byte bVar9;
  ShaderCreateInfo in_stack_fffffffffffffd48;
  undefined1 local_1d8 [8];
  string msg_1;
  undefined1 local_120 [8];
  ShaderCreateInfo SerCI;
  CompiledShaderGL *pCompiledShaderGL;
  ShaderCreateInfo *CI;
  value_type *Stage;
  size_t i;
  string msg;
  char local_34 [4];
  undefined1 local_30 [3];
  bool WaitUntilShadersReady;
  SHADER_TYPE ActiveShaderStages;
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  ShaderStages;
  ComputePipelineStateCreateInfo *CreateInfo_local;
  SerializedPipelineStateImpl *this_local;
  
  bVar9 = 0;
  ShaderStages.
  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CreateInfo;
  std::
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  ::vector((vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
            *)local_30);
  local_34[0] = '\0';
  local_34[1] = '\0';
  local_34[2] = '\0';
  local_34[3] = '\0';
  Args_1_00 = (char (*) [64])local_34;
  PipelineStateUtils::
  ExtractShaders<Diligent::SerializedShaderImpl,std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>>>
            ((ComputePipelineStateCreateInfo *)
             ShaderStages.
             super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
              *)local_30,true,(SHADER_TYPE *)Args_1_00);
  pvVar2 = std::
           array<std::vector<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>,_7UL>
           ::operator[](&(this->m_Data).Shaders,0);
  bVar1 = std::
          vector<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
          ::empty(pvVar2);
  if (!bVar1) {
    FormatString<char[26],char[64]>
              ((string *)&i,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].empty()",
               Args_1_00);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"PatchShadersGL",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_GL.cpp"
               ,0x222);
    std::__cxx11::string::~string((string *)&i);
  }
  Stage = (value_type *)0x0;
  while( true ) {
    pvVar4 = (value_type *)
             std::
             vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
             ::size((vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                     *)local_30);
    if (pvVar4 <= Stage) break;
    pvVar5 = std::
             vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
             ::operator[]((vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                           *)local_30,(size_type)Stage);
    __src = SerializedShaderImpl::GetCreateInfo(pvVar5->pShader);
    this_00 = SerializedShaderImpl::GetShader<Diligent::(anonymous_namespace)::CompiledShaderGL>
                        (pvVar5->pShader,OpenGL);
    __dest = (undefined8 *)((long)&msg_1.field_2 + 8);
    SerCI.WebGPUEmulatedArrayIndexSuffix = (char *)this_00;
    memcpy(__dest,__src,0x98);
    puVar8 = (undefined8 *)&stack0xfffffffffffffd48;
    for (lVar7 = 0x13; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar8 = *__dest;
      __dest = __dest + (ulong)bVar9 * -2 + 1;
      puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
    }
    anon_unknown_1::CompiledShaderGL::GetSerializationCI
              ((ShaderCreateInfo *)local_120,this_00,in_stack_fffffffffffffd48);
    SerializeShaderCreateInfo(this,OpenGL,(ShaderCreateInfo *)local_120);
    Stage = (value_type *)((long)&Stage->Type + 1);
  }
  pvVar2 = std::
           array<std::vector<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>,_7UL>
           ::operator[](&(this->m_Data).Shaders,0);
  pacVar6 = (char (*) [86])
            std::
            vector<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
            ::size(pvVar2);
  Args_1 = (char (*) [86])
           std::
           vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
           ::size((vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                   *)local_30);
  if (pacVar6 != Args_1) {
    FormatString<char[26],char[86]>
              ((string *)local_1d8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].size() == ShaderStages.size()"
               ,Args_1);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"PatchShadersGL",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_GL.cpp"
               ,0x22c);
    std::__cxx11::string::~string((string *)local_1d8);
  }
  std::
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  ::~vector((vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
             *)local_30);
  return;
}

Assistant:

void SerializedPipelineStateImpl::PatchShadersGL(const CreateInfoType& CreateInfo) noexcept(false)
{
    std::vector<ShaderStageInfoGL> ShaderStages;
    SHADER_TYPE                    ActiveShaderStages    = SHADER_TYPE_UNKNOWN;
    constexpr bool                 WaitUntilShadersReady = true;
    PipelineStateUtils::ExtractShaders<SerializedShaderImpl>(CreateInfo, ShaderStages, WaitUntilShadersReady, ActiveShaderStages);

    VERIFY_EXPR(m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].empty());
    for (size_t i = 0; i < ShaderStages.size(); ++i)
    {
        const auto& Stage             = ShaderStages[i];
        const auto& CI                = Stage.pShader->GetCreateInfo();
        const auto* pCompiledShaderGL = Stage.pShader->GetShader<CompiledShaderGL>(DeviceObjectArchive::DeviceType::OpenGL);
        const auto  SerCI             = pCompiledShaderGL->GetSerializationCI(CI);

        SerializeShaderCreateInfo(DeviceType::OpenGL, SerCI);
    }
    VERIFY_EXPR(m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].size() == ShaderStages.size());
}